

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

UniquePtr<DTLSIncomingMessage> __thiscall
bssl::dtls_new_incoming_message(bssl *this,hm_header_st *msg_hdr)

{
  uint8_t uVar1;
  uint16_t uVar2;
  bool bVar3;
  int iVar4;
  pointer pDVar5;
  cbb_st *pcVar6;
  uchar *buf;
  unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> local_50;
  UniquePtr<DTLSIncomingMessage> frag;
  ScopedCBB cbb;
  hm_header_st *msg_hdr_local;
  
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&frag);
  MakeUnique<bssl::DTLSIncomingMessage>();
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_50);
  if (bVar3) {
    uVar1 = msg_hdr->type;
    pDVar5 = std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::operator->
                       (&local_50);
    pDVar5->type = uVar1;
    uVar2 = msg_hdr->seq;
    pDVar5 = std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::operator->
                       (&local_50);
    pDVar5->seq = uVar2;
    pDVar5 = std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::operator->
                       (&local_50);
    bVar3 = Array<unsigned_char>::InitForOverwrite(&pDVar5->data,(ulong)(msg_hdr->msg_len + 0xc));
    if (bVar3) {
      pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&frag);
      pDVar5 = std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::operator->
                         (&local_50);
      buf = Array<unsigned_char>::data(&pDVar5->data);
      iVar4 = CBB_init_fixed(pcVar6,buf,0xc);
      if (iVar4 != 0) {
        pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&frag);
        iVar4 = CBB_add_u8(pcVar6,msg_hdr->type);
        if (iVar4 != 0) {
          pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&frag);
          iVar4 = CBB_add_u24(pcVar6,msg_hdr->msg_len);
          if (iVar4 != 0) {
            pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&frag);
            iVar4 = CBB_add_u16(pcVar6,msg_hdr->seq);
            if (iVar4 != 0) {
              pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&frag);
              iVar4 = CBB_add_u24(pcVar6,0);
              if (iVar4 != 0) {
                pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                   ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&frag);
                iVar4 = CBB_add_u24(pcVar6,msg_hdr->msg_len);
                if (iVar4 != 0) {
                  pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&frag
                                     );
                  iVar4 = CBB_finish(pcVar6,(uint8_t **)0x0,(size_t *)0x0);
                  if (iVar4 != 0) {
                    pDVar5 = std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::
                             operator->(&local_50);
                    bVar3 = DTLSMessageBitmap::Init(&pDVar5->reassembly,(ulong)msg_hdr->msg_len);
                    if (bVar3) {
                      std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::
                      unique_ptr((unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> *)
                                 this,&local_50);
                    }
                    else {
                      std::unique_ptr<bssl::DTLSIncomingMessage,bssl::internal::Deleter>::
                      unique_ptr<bssl::internal::Deleter,void>
                                ((unique_ptr<bssl::DTLSIncomingMessage,bssl::internal::Deleter> *)
                                 this,(nullptr_t)0x0);
                    }
                    goto LAB_001d7e6c;
                  }
                }
              }
            }
          }
        }
      }
      std::unique_ptr<bssl::DTLSIncomingMessage,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bssl::DTLSIncomingMessage,bssl::internal::Deleter> *)this,
                 (nullptr_t)0x0);
    }
    else {
      std::unique_ptr<bssl::DTLSIncomingMessage,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bssl::DTLSIncomingMessage,bssl::internal::Deleter> *)this,
                 (nullptr_t)0x0);
    }
  }
  else {
    std::unique_ptr<bssl::DTLSIncomingMessage,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bssl::DTLSIncomingMessage,bssl::internal::Deleter> *)this,(nullptr_t)0x0)
    ;
  }
LAB_001d7e6c:
  std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::~unique_ptr(&local_50);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&frag);
  return (__uniq_ptr_data<bssl::DTLSIncomingMessage,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bssl::DTLSIncomingMessage,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static UniquePtr<DTLSIncomingMessage> dtls_new_incoming_message(
    const struct hm_header_st *msg_hdr) {
  ScopedCBB cbb;
  UniquePtr<DTLSIncomingMessage> frag = MakeUnique<DTLSIncomingMessage>();
  if (!frag) {
    return nullptr;
  }
  frag->type = msg_hdr->type;
  frag->seq = msg_hdr->seq;

  // Allocate space for the reassembled message and fill in the header.
  if (!frag->data.InitForOverwrite(DTLS1_HM_HEADER_LENGTH + msg_hdr->msg_len)) {
    return nullptr;
  }

  if (!CBB_init_fixed(cbb.get(), frag->data.data(), DTLS1_HM_HEADER_LENGTH) ||
      !CBB_add_u8(cbb.get(), msg_hdr->type) ||
      !CBB_add_u24(cbb.get(), msg_hdr->msg_len) ||
      !CBB_add_u16(cbb.get(), msg_hdr->seq) ||
      !CBB_add_u24(cbb.get(), 0 /* frag_off */) ||
      !CBB_add_u24(cbb.get(), msg_hdr->msg_len) ||
      !CBB_finish(cbb.get(), NULL, NULL)) {
    return nullptr;
  }

  if (!frag->reassembly.Init(msg_hdr->msg_len)) {
    return nullptr;
  }

  return frag;
}